

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O2

mkv_timestamp_t MATROSKA_SegmentInfoTimestampScale(ebml_master *SegmentInfo)

{
  ebml_context *peVar1;
  bool_t bVar2;
  ebml_integer *Element;
  int64_t iVar3;
  
  if (SegmentInfo != (ebml_master *)0x0) {
    peVar1 = MATROSKA_getContextInfo();
    bVar2 = EBML_ElementIsType(&SegmentInfo->Base,peVar1);
    if (bVar2 == 0) {
      __assert_fail("EBML_ElementIsType((ebml_element*)SegmentInfo, MATROSKA_getContextInfo())",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x309,"mkv_timestamp_t MATROSKA_SegmentInfoTimestampScale(const ebml_master *)"
                   );
    }
    peVar1 = MATROSKA_getContextTimestampScale();
    Element = (ebml_integer *)EBML_MasterFindFirstElt(SegmentInfo,peVar1,0,0,0);
    if (Element != (ebml_integer *)0x0) {
      iVar3 = EBML_IntegerValue(Element);
      return iVar3;
    }
  }
  peVar1 = MATROSKA_getContextTimestampScale();
  return peVar1->DefaultValue;
}

Assistant:

mkv_timestamp_t MATROSKA_SegmentInfoTimestampScale(const ebml_master *SegmentInfo)
{
    ebml_integer *TimestampScale = NULL;
    if (SegmentInfo)
    {
        assert(EBML_ElementIsType((ebml_element*)SegmentInfo, MATROSKA_getContextInfo()));
        TimestampScale = (ebml_integer*)EBML_MasterFindChild((ebml_master*)SegmentInfo,MATROSKA_getContextTimestampScale());
    }
    if (!TimestampScale)
        return MATROSKA_getContextTimestampScale()->DefaultValue;
    return EBML_IntegerValue(TimestampScale);
}